

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn.c
# Opt level: O3

void bignum_to_string(bn *n,char *str,int nbytes)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint32_t *puVar7;
  
  if (n == (bn *)0x0) {
    __assert_fail("n && \"n is null\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x7f,"void bignum_to_string(struct bn *, char *, int)");
  }
  if (str == (char *)0x0) {
    __assert_fail("str && \"str is null\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x80,"void bignum_to_string(struct bn *, char *, int)");
  }
  if (nbytes < 1) {
    __assert_fail("nbytes > 0 && \"nbytes must be positive\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x81,"void bignum_to_string(struct bn *, char *, int)");
  }
  if ((nbytes & 1U) != 0) {
    __assert_fail("(nbytes & 1) == 0 && \"string format must be in hex -> equal number of bytes\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x82,"void bignum_to_string(struct bn *, char *, int)");
  }
  if (nbytes != 1) {
    puVar7 = n->array + 0x1f;
    lVar5 = 0;
    do {
      sprintf(str + lVar5,"%.08x",(ulong)*puVar7);
      if (lVar5 == 0xf8) break;
      uVar6 = lVar5 + 9;
      puVar7 = puVar7 + -1;
      lVar5 = lVar5 + 8;
    } while (uVar6 < (uint)nbytes);
  }
  uVar2 = 0xffffffff;
  pcVar3 = str;
  do {
    uVar2 = uVar2 + 1;
    cVar1 = *pcVar3;
    pcVar3 = pcVar3 + 1;
  } while (cVar1 == '0');
  if (nbytes - uVar2 == 0 || nbytes < (int)uVar2) {
    uVar6 = 0;
  }
  else {
    uVar6 = (ulong)(nbytes - uVar2);
    uVar4 = 0;
    do {
      str[uVar4] = str[uVar4 + uVar2];
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
  }
  str[uVar6] = '\0';
  return;
}

Assistant:

void bignum_to_string(struct bn* n, char* str, int nbytes)
{
  require(n, "n is null");
  require(str, "str is null");
  require(nbytes > 0, "nbytes must be positive");
  require((nbytes & 1) == 0, "string format must be in hex -> equal number of bytes");

  int j = BN_ARRAY_SIZE - 1; /* index into array - reading "MSB" first -> big-endian */
  int i = 0;                 /* index into string representation. */

  /* reading last array-element "MSB" first -> big endian */
  while ((j >= 0) && (nbytes > (i + 1)))
  {
    sprintf(&str[i], SPRINTF_FORMAT_STR, n->array[j]);
    i += (2 * WORD_SIZE); /* step WORD_SIZE hex-byte(s) forward in the string. */
    j -= 1;               /* step one element back in the array. */
  }

  /* Count leading zeros: */
  j = 0;
  while (str[j] == '0')
  {
    j += 1;
  }
 
  /* Move string j places ahead, effectively skipping leading zeros */ 
  for (i = 0; i < (nbytes - j); ++i)
  {
    str[i] = str[i + j];
  }

  /* Zero-terminate string */
  str[i] = 0;
}